

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O1

void duckdb::CheckOnConflictCondition
               (ExecutionContext *context,DataChunk *conflicts,
               unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
               *condition,DataChunk *result)

{
  ClientContext *pCVar1;
  type expression;
  initializer_list<duckdb::LogicalType> __l;
  ExpressionExecutor executor;
  allocator_type local_99;
  LogicalType local_98;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_80;
  ExpressionExecutor local_68;
  
  pCVar1 = context->client;
  expression = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(condition);
  ExpressionExecutor::ExpressionExecutor(&local_68,pCVar1,expression);
  pCVar1 = context->client;
  LogicalType::LogicalType(&local_98,BOOLEAN);
  __l._M_len = 1;
  __l._M_array = &local_98;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_80,__l,&local_99);
  DataChunk::Initialize(result,pCVar1,(vector<duckdb::LogicalType,_true> *)&local_80,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_80);
  LogicalType::~LogicalType(&local_98);
  ExpressionExecutor::Execute(&local_68,conflicts,result);
  result->count = conflicts->count;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
  ::~vector(&local_68.states.
             super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
           );
  if (local_68.expressions.
      super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
      super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.expressions.
                    super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    .
                    super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CheckOnConflictCondition(ExecutionContext &context, DataChunk &conflicts, const unique_ptr<Expression> &condition,
                              DataChunk &result) {
	ExpressionExecutor executor(context.client, *condition);
	result.Initialize(context.client, {LogicalType::BOOLEAN});
	executor.Execute(conflicts, result);
	result.SetCardinality(conflicts.size());
}